

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

void rsg::interpolateFragmentInput<64>
               (StridedValueAccess<64> dst,int dstComp,ConstValueAccess vtx0,ConstValueAccess vtx1,
               ConstValueAccess vtx2,ConstValueAccess vtx3,float x,float y)

{
  deBool dVar1;
  Type TVar2;
  VariableType *pVVar3;
  TestError *this;
  float *pfVar4;
  float fVar5;
  float y_;
  float z_;
  float w_;
  ConstStridedValueAccess<64> local_b0;
  ConstStridedValueAccess<1> local_a0;
  ConstStridedValueAccess<1> local_90;
  ConstStridedValueAccess<1> local_80;
  ConstStridedValueAccess<1> local_70;
  Vector<float,_4> local_5c;
  int local_4c;
  int local_48;
  int ndx;
  int numElements;
  float local_34;
  float local_30;
  float y_local;
  float x_local;
  int dstComp_local;
  ConstValueAccess vtx0_local;
  StridedValueAccess<64> dst_local;
  
  vtx0_local.m_type = (VariableType *)vtx0.m_value;
  _x_local = vtx0.m_type;
  vtx0_local.m_value = (Scalar *)dst.super_ConstStridedValueAccess<64>.m_type;
  local_34 = y;
  local_30 = x;
  y_local = (float)dstComp;
  while( true ) {
    dVar1 = ::deGetFalse();
    if (dVar1 != 0) break;
    pVVar3 = ConstStridedValueAccess<64>::getType
                       ((ConstStridedValueAccess<64> *)&vtx0_local.m_value);
    TVar2 = VariableType::getBaseType(pVVar3);
    if (TVar2 != TYPE_FLOAT) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      pVVar3 = ConstStridedValueAccess<64>::getType
                         ((ConstStridedValueAccess<64> *)&vtx0_local.m_value);
      local_48 = VariableType::getNumElements(pVVar3);
      for (local_4c = 0; local_4c < local_48; local_4c = local_4c + 1) {
        local_70 = ConstStridedValueAccess<1>::component
                             ((ConstStridedValueAccess<1> *)&x_local,local_4c);
        fVar5 = ConstStridedValueAccess<1>::asFloat(&local_70);
        local_80 = ConstStridedValueAccess<1>::component(&vtx1,local_4c);
        y_ = ConstStridedValueAccess<1>::asFloat(&local_80);
        local_90 = ConstStridedValueAccess<1>::component(&vtx2,local_4c);
        z_ = ConstStridedValueAccess<1>::asFloat(&local_90);
        local_a0 = ConstStridedValueAccess<1>::component(&vtx3,local_4c);
        w_ = ConstStridedValueAccess<1>::asFloat(&local_a0);
        tcu::Vector<float,_4>::Vector(&local_5c,fVar5,y_,z_,w_);
        fVar5 = interpolateFragment(&local_5c,local_30,local_34);
        local_b0 = (ConstStridedValueAccess<64>)
                   StridedValueAccess<64>::component
                             ((StridedValueAccess<64> *)&vtx0_local.m_value,local_4c);
        pfVar4 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&local_b0,(int)y_local);
        *pfVar4 = fVar5;
      }
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"dst.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0x99);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void interpolateFragmentInput (StridedValueAccess<Stride> dst, int dstComp, ConstValueAccess vtx0, ConstValueAccess vtx1, ConstValueAccess vtx2, ConstValueAccess vtx3, float x, float y)
{
	TCU_CHECK(dst.getType().getBaseType() == VariableType::TYPE_FLOAT);
	int numElements = dst.getType().getNumElements();
	for (int ndx = 0; ndx < numElements; ndx++)
		dst.component(ndx).asFloat(dstComp) = interpolateFragment(tcu::Vec4(vtx0.component(ndx).asFloat(), vtx1.component(ndx).asFloat(), vtx2.component(ndx).asFloat(), vtx3.component(ndx).asFloat()), x, y);
}